

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.h
# Opt level: O3

void __thiscall
wasm::WasmBinaryWriter::BinaryIndexes::BinaryIndexes(BinaryIndexes *this,Module *wasm)

{
  pointer puVar1;
  Function *pFVar2;
  size_type sVar3;
  pointer puVar4;
  Tag *pTVar5;
  pointer puVar6;
  Table *pTVar7;
  pointer puVar8;
  Memory *pMVar9;
  pointer puVar10;
  pointer puVar11;
  pointer puVar12;
  Global *pGVar13;
  mapped_type *pmVar14;
  size_t sVar15;
  anon_class_8_1_f72e7be0 addIndex;
  mapped_type mVar16;
  anon_class_8_1_f72e7be0 addIndex_1;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *curr;
  pointer puVar17;
  pointer puVar18;
  pointer puVar19;
  pointer puVar20;
  pointer puVar21;
  pointer puVar22;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *curr_10;
  pointer puVar23;
  anon_class_8_1_f72e7be0 addIndex_2;
  anon_class_8_1_f72e7be0 addIndex_3;
  
  (this->functionIndexes)._M_h._M_buckets = &(this->functionIndexes)._M_h._M_single_bucket;
  (this->functionIndexes)._M_h._M_bucket_count = 1;
  (this->functionIndexes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->functionIndexes)._M_h._M_element_count = 0;
  (this->functionIndexes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->functionIndexes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->functionIndexes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->tagIndexes)._M_h._M_buckets = &(this->tagIndexes)._M_h._M_single_bucket;
  (this->tagIndexes)._M_h._M_bucket_count = 1;
  (this->tagIndexes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->tagIndexes)._M_h._M_element_count = 0;
  (this->tagIndexes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->tagIndexes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->tagIndexes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->globalIndexes)._M_h._M_buckets = &(this->globalIndexes)._M_h._M_single_bucket;
  (this->globalIndexes)._M_h._M_bucket_count = 1;
  (this->globalIndexes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->globalIndexes)._M_h._M_element_count = 0;
  (this->globalIndexes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->globalIndexes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->globalIndexes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->tableIndexes)._M_h._M_buckets = &(this->tableIndexes)._M_h._M_single_bucket;
  (this->tableIndexes)._M_h._M_bucket_count = 1;
  (this->tableIndexes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->tableIndexes)._M_h._M_element_count = 0;
  (this->tableIndexes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->tableIndexes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->tableIndexes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->elemIndexes)._M_h._M_buckets = &(this->elemIndexes)._M_h._M_single_bucket;
  (this->elemIndexes)._M_h._M_bucket_count = 1;
  (this->elemIndexes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->elemIndexes)._M_h._M_element_count = 0;
  (this->elemIndexes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->elemIndexes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->elemIndexes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->memoryIndexes)._M_h._M_buckets = &(this->memoryIndexes)._M_h._M_single_bucket;
  (this->memoryIndexes)._M_h._M_bucket_count = 1;
  (this->memoryIndexes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->memoryIndexes)._M_h._M_element_count = 0;
  (this->memoryIndexes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->memoryIndexes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->memoryIndexes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->dataIndexes)._M_h._M_buckets = &(this->dataIndexes)._M_h._M_single_bucket;
  (this->dataIndexes)._M_h._M_bucket_count = 1;
  (this->dataIndexes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->dataIndexes)._M_h._M_element_count = 0;
  (this->dataIndexes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->dataIndexes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->dataIndexes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  puVar17 = (wasm->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (wasm->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar17 != puVar1) {
    do {
      pFVar2 = (puVar17->_M_t).
               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      if (*(char **)((long)&(pFVar2->super_Importable).module + 8) != (char *)0x0) {
        sVar3 = (this->functionIndexes)._M_h._M_element_count;
        pmVar14 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)this,(key_type *)pFVar2);
        *pmVar14 = (mapped_type)sVar3;
      }
      puVar17 = puVar17 + 1;
    } while (puVar17 != puVar1);
    puVar1 = (wasm->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar17 = (wasm->functions).
                   super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar17 != puVar1;
        puVar17 = puVar17 + 1) {
      pFVar2 = (puVar17->_M_t).
               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      if (*(char **)((long)&(pFVar2->super_Importable).module + 8) == (char *)0x0) {
        sVar3 = (this->functionIndexes)._M_h._M_element_count;
        pmVar14 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)this,(key_type *)pFVar2);
        *pmVar14 = (mapped_type)sVar3;
      }
    }
  }
  puVar18 = (wasm->tags).
            super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar4 = (wasm->tags).
           super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar18 != puVar4) {
    do {
      pTVar5 = (puVar18->_M_t).super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>.
               _M_t.super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
               super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl;
      if (*(char **)((long)&(pTVar5->super_Importable).module + 8) != (char *)0x0) {
        sVar3 = (this->tagIndexes)._M_h._M_element_count;
        pmVar14 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&this->tagIndexes,(key_type *)pTVar5);
        *pmVar14 = (mapped_type)sVar3;
      }
      puVar18 = puVar18 + 1;
    } while (puVar18 != puVar4);
    puVar4 = (wasm->tags).
             super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar18 = (wasm->tags).
                   super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar18 != puVar4;
        puVar18 = puVar18 + 1) {
      pTVar5 = (puVar18->_M_t).super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>.
               _M_t.super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
               super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl;
      if (*(char **)((long)&(pTVar5->super_Importable).module + 8) == (char *)0x0) {
        sVar3 = (this->tagIndexes)._M_h._M_element_count;
        pmVar14 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&this->tagIndexes,(key_type *)pTVar5);
        *pmVar14 = (mapped_type)sVar3;
      }
    }
  }
  puVar19 = (wasm->tables).
            super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar6 = (wasm->tables).
           super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar19 != puVar6) {
    do {
      pTVar7 = (puVar19->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>
               ._M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
               super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
      if (*(char **)((long)&(pTVar7->super_Importable).module + 8) != (char *)0x0) {
        sVar3 = (this->tableIndexes)._M_h._M_element_count;
        pmVar14 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&this->tableIndexes,(key_type *)pTVar7);
        *pmVar14 = (mapped_type)sVar3;
      }
      puVar19 = puVar19 + 1;
    } while (puVar19 != puVar6);
    puVar6 = (wasm->tables).
             super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar19 = (wasm->tables).
                   super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar19 != puVar6;
        puVar19 = puVar19 + 1) {
      pTVar7 = (puVar19->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>
               ._M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
               super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
      if (*(char **)((long)&(pTVar7->super_Importable).module + 8) == (char *)0x0) {
        sVar3 = (this->tableIndexes)._M_h._M_element_count;
        pmVar14 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&this->tableIndexes,(key_type *)pTVar7);
        *pmVar14 = (mapped_type)sVar3;
      }
    }
  }
  puVar20 = (wasm->memories).
            super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar8 = (wasm->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar20 != puVar8) {
    do {
      pMVar9 = (puVar20->_M_t).
               super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
               super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
      if (*(char **)((long)&(pMVar9->super_Importable).module + 8) != (char *)0x0) {
        sVar3 = (this->memoryIndexes)._M_h._M_element_count;
        pmVar14 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&this->memoryIndexes,(key_type *)pMVar9);
        *pmVar14 = (mapped_type)sVar3;
      }
      puVar20 = puVar20 + 1;
    } while (puVar20 != puVar8);
    puVar8 = (wasm->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar20 = (wasm->memories).
                   super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar20 != puVar8;
        puVar20 = puVar20 + 1) {
      pMVar9 = (puVar20->_M_t).
               super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
               super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
      if (*(char **)((long)&(pMVar9->super_Importable).module + 8) == (char *)0x0) {
        sVar3 = (this->memoryIndexes)._M_h._M_element_count;
        pmVar14 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&this->memoryIndexes,(key_type *)pMVar9);
        *pmVar14 = (mapped_type)sVar3;
      }
    }
  }
  puVar10 = (wasm->elementSegments).
            super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar21 = (wasm->elementSegments).
                 super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar21 != puVar10;
      puVar21 = puVar21 + 1) {
    sVar3 = (this->elemIndexes)._M_h._M_element_count;
    pmVar14 = std::__detail::
              _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&this->elemIndexes,
                           (key_type *)
                           (puVar21->_M_t).
                           super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                           .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl);
    *pmVar14 = (mapped_type)sVar3;
  }
  puVar11 = (wasm->dataSegments).
            super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar22 = (wasm->dataSegments).
                 super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar22 != puVar11;
      puVar22 = puVar22 + 1) {
    sVar3 = (this->dataIndexes)._M_h._M_element_count;
    pmVar14 = std::__detail::
              _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&this->dataIndexes,
                           (key_type *)
                           (puVar22->_M_t).
                           super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                           .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl);
    *pmVar14 = (mapped_type)sVar3;
  }
  puVar23 = (wasm->globals).
            super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar12 = (wasm->globals).
            super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar23 != puVar12) {
    mVar16 = 0;
    do {
      pGVar13 = (puVar23->_M_t).
                super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      if (*(char **)((long)&(pGVar13->super_Importable).module + 8) != (char *)0x0) {
        pmVar14 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&this->globalIndexes,(key_type *)pGVar13);
        *pmVar14 = mVar16;
        sVar15 = Type::size(&pGVar13->type);
        mVar16 = mVar16 + (int)sVar15;
      }
      puVar23 = puVar23 + 1;
    } while (puVar23 != puVar12);
    puVar12 = (wasm->globals).
              super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar23 = (wasm->globals).
                   super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar23 != puVar12;
        puVar23 = puVar23 + 1) {
      pGVar13 = (puVar23->_M_t).
                super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      if (*(char **)((long)&(pGVar13->super_Importable).module + 8) == (char *)0x0) {
        pmVar14 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&this->globalIndexes,(key_type *)pGVar13);
        *pmVar14 = mVar16;
        sVar15 = Type::size(&pGVar13->type);
        mVar16 = mVar16 + (int)sVar15;
      }
    }
  }
  return;
}

Assistant:

BinaryIndexes(Module& wasm) {
      auto addIndexes = [&](auto& source, auto& indexes) {
        auto addIndex = [&](auto* curr) {
          auto index = indexes.size();
          indexes[curr->name] = index;
        };
        for (auto& curr : source) {
          if (curr->imported()) {
            addIndex(curr.get());
          }
        }
        for (auto& curr : source) {
          if (!curr->imported()) {
            addIndex(curr.get());
          }
        }
      };
      addIndexes(wasm.functions, functionIndexes);
      addIndexes(wasm.tags, tagIndexes);
      addIndexes(wasm.tables, tableIndexes);
      addIndexes(wasm.memories, memoryIndexes);

      for (auto& curr : wasm.elementSegments) {
        auto index = elemIndexes.size();
        elemIndexes[curr->name] = index;
      }

      for (auto& curr : wasm.dataSegments) {
        auto index = dataIndexes.size();
        dataIndexes[curr->name] = index;
      }

      // Globals may have tuple types in the IR, in which case they lower to
      // multiple globals, one for each tuple element, in the binary. Tuple
      // globals therefore occupy multiple binary indices, and we have to take
      // that into account when calculating indices.
      Index globalCount = 0;
      auto addGlobal = [&](auto* curr) {
        globalIndexes[curr->name] = globalCount;
        globalCount += curr->type.size();
      };
      for (auto& curr : wasm.globals) {
        if (curr->imported()) {
          addGlobal(curr.get());
        }
      }
      for (auto& curr : wasm.globals) {
        if (!curr->imported()) {
          addGlobal(curr.get());
        }
      }
    }